

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

Vector3<float> pbrt::Cross<float>(Vector3<float> *v,Vector3<float> *w)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3<float> VVar10;
  
  fVar1 = (w->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar2._0_4_ = (v->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar2._4_4_ = (v->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  uVar3._0_4_ = (w->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar3._4_4_ = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar6 = ZEXT416((uint)(v->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar4 = vpermt2ps_avx512vl(auVar7,_DAT_004bc8f0,auVar6);
  auVar9._0_4_ = (float)(undefined4)uVar3 * auVar4._0_4_;
  auVar9._4_4_ = (float)uVar3._4_4_ * auVar4._4_4_;
  auVar9._8_4_ = auVar4._8_4_ * 0.0;
  auVar9._12_4_ = auVar4._12_4_ * 0.0;
  auVar5 = vpermi2ps_avx512vl(_DAT_004bc8f0,auVar8,ZEXT416((uint)fVar1));
  auVar5 = vfmsub213ps_fma(auVar5,auVar7,auVar9);
  auVar4 = vfnmadd213ps_fma(auVar4,auVar8,auVar9);
  VVar10.super_Tuple3<pbrt::Vector3,_float>.x = auVar5._0_4_ + auVar4._0_4_;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.y = auVar5._4_4_ + auVar4._4_4_;
  auVar5 = vfmsub213ss_fma(auVar8,auVar6,ZEXT416((uint)((float)(undefined4)uVar2 * fVar1)));
  auVar4 = vfnmadd213ss_fma(ZEXT416((uint)fVar1),auVar7,
                            ZEXT416((uint)((float)(undefined4)uVar2 * fVar1)));
  VVar10.super_Tuple3<pbrt::Vector3,_float>.z = auVar5._0_4_ + auVar4._0_4_;
  return (Vector3<float>)VVar10.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU inline Vector3<T> Cross(const Vector3<T> &v, const Vector3<T> &w) {
    DCHECK(!v.HasNaN() && !w.HasNaN());
    return {DifferenceOfProducts(v.y, w.z, v.z, w.y),
            DifferenceOfProducts(v.z, w.x, v.x, w.z),
            DifferenceOfProducts(v.x, w.y, v.y, w.x)};
}